

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O3

bool tchecker::refdbm::is_le(db_t *rdbm1,db_t *rdbm2,reference_clock_variables_t *r)

{
  stored_size_type sVar1;
  bool bVar2;
  
  if (rdbm1 == (db_t *)0x0) {
    __assert_fail("rdbm1 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0xf2,
                  "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  if (rdbm2 == (db_t *)0x0) {
    __assert_fail("rdbm2 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0xf3,
                  "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar2 = is_consistent(rdbm1,r);
  if (!bVar2) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm1, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0xf4,
                  "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar2 = is_consistent(rdbm2,r);
  if (bVar2) {
    bVar2 = is_tight(rdbm1,r);
    if (!bVar2) {
      __assert_fail("tchecker::refdbm::is_tight(rdbm1, r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                    ,0xf6,
                    "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                   );
    }
    bVar2 = is_tight(rdbm2,r);
    if (bVar2) {
      sVar1 = *(stored_size_type *)
               ((long)&(r->super_flat_clock_variables_t).
                       super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._index._key_map.m_flat_tree.m_data + 8);
      if (sVar1 == *(stored_size_type *)
                    ((long)&(r->super_flat_clock_variables_t).
                            super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._index._value_map.m_flat_tree.m_data + 8)) {
        bVar2 = tchecker::dbm::is_le(rdbm1,rdbm2,(clock_id_t)sVar1);
        return bVar2;
      }
      __assert_fail("_key_map.size() == _value_map.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                    ,0x90,
                    "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
                   );
    }
    __assert_fail("tchecker::refdbm::is_tight(rdbm2, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0xf7,
                  "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  __assert_fail("tchecker::refdbm::is_consistent(rdbm2, r)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                ,0xf5,
                "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
               );
}

Assistant:

bool is_le(tchecker::dbm::db_t const * rdbm1, tchecker::dbm::db_t const * rdbm2,
           tchecker::reference_clock_variables_t const & r)
{
  assert(rdbm1 != nullptr);
  assert(rdbm2 != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm1, r));
  assert(tchecker::refdbm::is_consistent(rdbm2, r));
  assert(tchecker::refdbm::is_tight(rdbm1, r));
  assert(tchecker::refdbm::is_tight(rdbm2, r));
  return tchecker::dbm::is_le(rdbm1, rdbm2, r.size());
}